

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O3

entry * __thiscall mpt::message_store::next(message_store *this)

{
  uint uVar1;
  content<mpt::message_store::entry> *pcVar2;
  content<mpt::message_store::entry> *d;
  
  pcVar2 = (this->_msg).super_unique_array<mpt::message_store::entry>._ref._ref;
  if (pcVar2 != (content<mpt::message_store::entry> *)0x0) {
    uVar1 = this->_act;
    if ((ulong)uVar1 < (pcVar2->super_buffer)._used >> 3) {
      this->_act = uVar1 + 1;
      return (entry *)(&pcVar2[1].super_buffer._vptr_buffer + uVar1);
    }
  }
  return (entry *)0x0;
}

Assistant:

inline T *instance() const
	{ 
		return _ref;
	}